

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaXPathProcessHistory(xmlSchemaValidCtxtPtr vctxt,int depth)

{
  xmlSchemaTypeType xVar1;
  xmlSchemaIDCPtr_conflict pxVar2;
  xmlSchemaValPtr item;
  xmlSchemaItemListPtr item_00;
  xmlSchemaValidCtxtPtr pxVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlSchemaPSVIIDCKeyPtr pxVar6;
  xmlHashTablePtr pxVar7;
  xmlChar *pxVar8;
  xmlChar *local_110;
  xmlChar *str_3;
  xmlIDCHashEntryPtr_conflict e_1;
  xmlIDCHashEntryPtr_conflict r;
  xmlChar *value_1;
  xmlChar *strB;
  xmlChar *str_2;
  xmlChar *value;
  xmlIDCHashEntryPtr_conflict e;
  xmlSchemaPSVIIDCKeyPtr *bkeySeq;
  xmlSchemaPSVIIDCKeyPtr bkey;
  xmlSchemaPSVIIDCKeyPtr ckey;
  int nbKeys;
  int j;
  int i_1;
  int pos_1;
  xmlSchemaItemListPtr targets;
  xmlSchemaIDCPtr_conflict idc;
  xmlSchemaIDCMatcherPtr_conflict matcher_1;
  xmlSchemaPSVIIDCNodePtr ntItem;
  xmlSchemaPSVIIDCKeyPtr **keySeq_1;
  xmlChar *str_1;
  int local_70;
  int i;
  int idx;
  int pos;
  xmlSchemaPSVIIDCKeyPtr *keySeq;
  xmlSchemaIDCMatcherPtr_conflict matcher;
  xmlChar *str;
  xmlSchemaTypePtr simpleType;
  xmlSchemaTypePtr type;
  xmlSchemaPSVIIDCKeyPtr key;
  int matchDepth;
  int res;
  xmlSchemaIDCStateObjPtr_conflict nextsto;
  xmlSchemaIDCStateObjPtr_conflict sto;
  xmlSchemaValidCtxtPtr pxStack_18;
  int depth_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  type = (xmlSchemaTypePtr)0x0;
  simpleType = vctxt->inode->typeDef;
  str = (xmlChar *)0x0;
  if (vctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    nextsto = vctxt->xpathStates;
    sto._4_4_ = depth;
    pxStack_18 = vctxt;
    while (nextsto != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
      key._4_4_ = xmlStreamPop((xmlStreamCtxtPtr)nextsto->xpathCtxt);
      pxVar3 = pxStack_18;
      if (key._4_4_ == -1) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)pxStack_18,"xmlSchemaXPathProcessHistory",
                   "calling xmlStreamPop()");
        return -1;
      }
      if (nextsto->nbHistory == 0) goto LAB_002395cd;
      key._0_4_ = nextsto->history[nextsto->nbHistory + -1];
      if ((int)key == sto._4_4_) {
        if (nextsto->type == 2) {
          if ((simpleType->type == XML_SCHEMA_TYPE_COMPLEX) || (simpleType->builtInType == 0x2d)) {
            if ((simpleType->contentType == XML_SCHEMA_CONTENT_SIMPLE) ||
               (simpleType->contentType == XML_SCHEMA_CONTENT_BASIC)) {
              str = (xmlChar *)simpleType->contentTypeDef;
              if ((xmlSchemaTypePtr)str == (xmlSchemaTypePtr)0x0) {
                xmlSchemaInternalErr
                          ((xmlSchemaAbstractCtxtPtr)pxStack_18,"xmlSchemaXPathProcessHistory",
                           "field resolves to a CT with simple content but the CT is missing the ST definition"
                          );
                return -1;
              }
            }
            else {
              str = (xmlChar *)0x0;
            }
          }
          else {
            str = (xmlChar *)simpleType;
          }
          if (str == (xmlChar *)0x0) {
            matcher = (xmlSchemaIDCMatcherPtr_conflict)0x0;
            pxVar2 = nextsto->matcher->aidc->def;
            pxVar8 = nextsto->sel->xpath;
            pxVar5 = xmlSchemaGetIDCDesignation((xmlChar **)&matcher,nextsto->matcher->aidc->def);
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pxVar3,XML_SCHEMAV_CVC_IDC,(xmlNodePtr)0x0,
                               (xmlSchemaBasicItemPtr)pxVar2,
                               "The XPath \'%s\' of a field of %s does evaluate to a node of non-simple type"
                               ,pxVar8,pxVar5);
            if (matcher != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
              (*xmlFree)(matcher);
              matcher = (xmlSchemaIDCMatcherPtr_conflict)0x0;
            }
            nextsto->nbHistory = nextsto->nbHistory + -1;
          }
          else {
            if ((type != (xmlSchemaTypePtr)0x0) || (pxStack_18->inode->val != (xmlSchemaValPtr)0x0))
            {
              keySeq = (xmlSchemaPSVIIDCKeyPtr *)nextsto->matcher;
              i = nextsto->depth - ((xmlSchemaIDCMatcherPtr_conflict)keySeq)->depth;
              local_70 = nextsto->sel->index;
              if (((xmlSchemaIDCMatcherPtr_conflict)keySeq)->keySeqs ==
                  (xmlSchemaPSVIIDCKeyPtr **)0x0) {
                if (i < 10) {
                  ((xmlSchemaIDCMatcherPtr_conflict)keySeq)->sizeKeySeqs = 10;
                }
                else {
                  ((xmlSchemaIDCMatcherPtr_conflict)keySeq)->sizeKeySeqs = i * 2;
                }
                pxVar6 = (xmlSchemaPSVIIDCKeyPtr)
                         (*xmlMalloc)((long)((xmlSchemaIDCMatcherPtr_conflict)keySeq)->sizeKeySeqs
                                      << 3);
                keySeq[5] = pxVar6;
                if (keySeq[5] == (xmlSchemaPSVIIDCKeyPtr)0x0) {
                  xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,
                                      "allocating an array of key-sequences",(xmlNodePtr)0x0);
                  return -1;
                }
                memset(keySeq[5],0,(long)*(int *)(keySeq + 6) << 3);
              }
              else if (((xmlSchemaIDCMatcherPtr_conflict)keySeq)->sizeKeySeqs <= i) {
                str_1._4_4_ = ((xmlSchemaIDCMatcherPtr_conflict)keySeq)->sizeKeySeqs;
                ((xmlSchemaIDCMatcherPtr_conflict)keySeq)->sizeKeySeqs =
                     ((xmlSchemaIDCMatcherPtr_conflict)keySeq)->sizeKeySeqs << 1;
                pxVar6 = (xmlSchemaPSVIIDCKeyPtr)
                         (*xmlRealloc)(((xmlSchemaIDCMatcherPtr_conflict)keySeq)->keySeqs,
                                       (long)((xmlSchemaIDCMatcherPtr_conflict)keySeq)->sizeKeySeqs
                                       << 3);
                keySeq[5] = pxVar6;
                if (keySeq[5] == (xmlSchemaPSVIIDCKeyPtr)0x0) {
                  xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,
                                      "reallocating an array of key-sequences",(xmlNodePtr)0x0);
                  return -1;
                }
                for (; str_1._4_4_ < *(int *)(keySeq + 6); str_1._4_4_ = str_1._4_4_ + 1) {
                  (&keySeq[5]->type)[str_1._4_4_] = (xmlSchemaTypePtr)0x0;
                }
              }
              pxVar3 = pxStack_18;
              _idx = (&keySeq[5]->type)[i];
              if (_idx == (xmlSchemaTypePtr)0x0) {
                _idx = (xmlSchemaTypePtr)(*xmlMalloc)((long)keySeq[3]->val[1].value.b << 3);
                if (_idx == (xmlSchemaTypePtr)0x0) {
                  xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,"allocating an IDC key-sequence",
                                      (xmlNodePtr)0x0);
                  return -1;
                }
                memset(_idx,0,(long)keySeq[3]->val[1].value.b << 3);
                (&keySeq[5]->type)[i] = _idx;
              }
              else if (*(long *)(&_idx->type + (long)local_70 * 2) != 0) {
                keySeq_1 = (xmlSchemaPSVIIDCKeyPtr **)0x0;
                item = keySeq[3]->val;
                pxVar8 = nextsto->sel->xpath;
                pxVar5 = xmlSchemaGetIDCDesignation
                                   ((xmlChar **)&keySeq_1,(xmlSchemaIDCPtr_conflict)keySeq[3]->val);
                xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pxVar3,XML_SCHEMAV_CVC_IDC,
                                   (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)item,
                                   "The XPath \'%s\' of a field of %s evaluates to a node-set with more than one member"
                                   ,pxVar8,pxVar5);
                if (keySeq_1 != (xmlSchemaPSVIIDCKeyPtr **)0x0) {
                  (*xmlFree)(keySeq_1);
                  keySeq_1 = (xmlSchemaPSVIIDCKeyPtr **)0x0;
                }
                nextsto->nbHistory = nextsto->nbHistory + -1;
                goto LAB_002395cd;
              }
              if (type == (xmlSchemaTypePtr)0x0) {
                type = (xmlSchemaTypePtr)(*xmlMalloc)(0x10);
                if (type == (xmlSchemaTypePtr)0x0) {
                  xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,"allocating a IDC key",
                                      (xmlNodePtr)0x0);
                  (*xmlFree)(_idx);
                  (&keySeq[5]->type)[i] = (xmlSchemaTypePtr)0x0;
                  return -1;
                }
                *(xmlChar **)type = str;
                type->next = (_xmlSchemaType *)pxStack_18->inode->val;
                pxStack_18->inode->val = (xmlSchemaValPtr)0x0;
                iVar4 = xmlSchemaIDCStoreKey(pxStack_18,(xmlSchemaPSVIIDCKeyPtr)type);
                if (iVar4 == -1) {
                  xmlSchemaIDCFreeKey((xmlSchemaPSVIIDCKeyPtr)type);
                  return -1;
                }
              }
              *(xmlSchemaTypePtr *)(&_idx->type + (long)local_70 * 2) = type;
              goto LAB_002395c0;
            }
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pxStack_18,XML_SCHEMAV_CVC_IDC,
                               (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)nextsto->matcher->aidc->def,
                               "Warning: No precomputed value available, the value was either invalid or something strange happened"
                               ,(xmlChar *)0x0,(xmlChar *)0x0);
            nextsto->nbHistory = nextsto->nbHistory + -1;
          }
        }
        else {
          if (nextsto->type == 1) {
            ntItem = (xmlSchemaPSVIIDCNodePtr)0x0;
            idc = (xmlSchemaIDCPtr_conflict)nextsto->matcher;
            pxVar2 = *(xmlSchemaIDCPtr_conflict *)&idc->node->type;
            ckey._0_4_ = pxVar2->nbFields;
            j = sto._4_4_ - *(int *)&idc->field_0x4;
            targets = (xmlSchemaItemListPtr)pxVar2;
            if (((xmlSchemaPSVIIDCKeyPtr **)idc->targetNamespace == (xmlSchemaPSVIIDCKeyPtr **)0x0)
               || (*(int *)&idc->selector <= j)) {
              xVar1 = pxVar2->type;
joined_r0x00238ef7:
              if (xVar1 == XML_SCHEMA_TYPE_IDC_KEY) {
                local_110 = (xmlChar *)0x0;
                pxVar8 = xmlSchemaGetIDCDesignation(&local_110,pxVar2);
                xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pxVar3,XML_SCHEMAV_CVC_IDC,
                                   (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)pxVar2,
                                   "Not all fields of %s evaluate to a node",pxVar8,(xmlChar *)0x0);
                if (local_110 != (xmlChar *)0x0) {
                  (*xmlFree)(local_110);
                  local_110 = (xmlChar *)0x0;
                }
              }
            }
            else {
              ntItem = (xmlSchemaPSVIIDCNodePtr)((long)idc->targetNamespace + (long)j * 8);
              if (ntItem->node == (xmlNodePtr)0x0) {
                xVar1 = pxVar2->type;
                goto joined_r0x00238ef7;
              }
              for (nbKeys = 0; nbKeys < (int)ckey; nbKeys = nbKeys + 1) {
                if ((xmlSchemaPSVIIDCKeyPtr)(&ntItem->node->_private)[nbKeys] ==
                    (xmlSchemaPSVIIDCKeyPtr)0x0) {
                  xVar1 = pxVar2->type;
                  goto joined_r0x00238ef7;
                }
              }
              _i_1 = xmlSchemaIDCAcquireTargetList(pxStack_18,(xmlSchemaIDCMatcherPtr_conflict)idc);
              if ((*(int *)&targets->items == 0x18) || (_i_1->nbItems == 0)) {
LAB_002391c9:
                matcher_1 = (xmlSchemaIDCMatcherPtr_conflict)(*xmlMalloc)(0x18);
                if (matcher_1 == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
                  xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,"allocating an IDC node-table item"
                                      ,(xmlNodePtr)0x0);
                  (*xmlFree)(ntItem->node);
                  ntItem->node = (xmlNodePtr)0x0;
                  return -1;
                }
                memset(matcher_1,0,0x18);
                if (*(int *)&targets->items == 0x18) {
                  iVar4 = xmlSchemaVAddNodeQName
                                    (pxStack_18,pxStack_18->inode->localName,
                                     pxStack_18->inode->nsName);
                  *(int *)((long)&matcher_1->nextCached + 4) = iVar4;
                  if (*(int *)((long)&matcher_1->nextCached + 4) == -1) {
                    (*xmlFree)(matcher_1);
                    (*xmlFree)(ntItem->node);
                    ntItem->node = (xmlNodePtr)0x0;
                    return -1;
                  }
                }
                else {
                  iVar4 = xmlSchemaIDCStoreNodeTableItem
                                    (pxStack_18,(xmlSchemaPSVIIDCNodePtr)matcher_1);
                  if (iVar4 == -1) {
                    (*xmlFree)(matcher_1);
                    (*xmlFree)(ntItem->node);
                    ntItem->node = (xmlNodePtr)0x0;
                    return -1;
                  }
                  *(undefined4 *)((long)&matcher_1->nextCached + 4) = 0xffffffff;
                }
                *(xmlNodePtr *)matcher_1 = pxStack_18->node;
                *(int *)&matcher_1->nextCached = pxStack_18->inode->nodeLine;
                matcher_1->next = (xmlSchemaIDCMatcherPtr)ntItem->node;
                ntItem->node = (xmlNodePtr)0x0;
                iVar4 = xmlSchemaItemListAdd(_i_1,matcher_1);
                if (iVar4 == -1) {
                  if (*(int *)&targets->items == 0x18) {
                    (*xmlFree)(matcher_1->next);
                    (*xmlFree)(matcher_1);
                  }
                  return -1;
                }
                if (*(int *)&targets->items != 0x18) {
                  r = (xmlIDCHashEntryPtr_conflict)0x0;
                  if (*(long *)&idc->nbFields == 0) {
                    pxVar7 = xmlHashCreate(4);
                    *(xmlHashTablePtr *)&idc->nbFields = pxVar7;
                  }
                  xmlSchemaHashKeySequence
                            (pxStack_18,(xmlChar **)&r,(xmlSchemaPSVIIDCKeyPtr *)matcher_1->next,
                             (int)ckey);
                  str_3 = (xmlChar *)(*xmlMalloc)(0x10);
                  *(int *)(str_3 + 8) = _i_1->nbItems + -1;
                  e_1 = (xmlIDCHashEntryPtr_conflict)
                        xmlHashLookup(*(xmlHashTablePtr *)&idc->nbFields,(xmlChar *)r);
                  if (e_1 == (xmlIDCHashEntryPtr_conflict)0x0) {
                    str_3[0] = '\0';
                    str_3[1] = '\0';
                    str_3[2] = '\0';
                    str_3[3] = '\0';
                    str_3[4] = '\0';
                    str_3[5] = '\0';
                    str_3[6] = '\0';
                    str_3[7] = '\0';
                    xmlHashAddEntry(*(xmlHashTablePtr *)&idc->nbFields,(xmlChar *)r,str_3);
                  }
                  else {
                    *(xmlIDCHashEntryPtr *)str_3 = e_1->next;
                    e_1->next = (xmlIDCHashEntryPtr)str_3;
                  }
                  if (r != (xmlIDCHashEntryPtr_conflict)0x0) {
                    (*xmlFree)(r);
                    r = (xmlIDCHashEntryPtr_conflict)0x0;
                  }
                }
              }
              else {
                key._4_4_ = 0;
                if (*(long *)&idc->nbFields == 0) {
                  value = (xmlChar *)0x0;
                }
                else {
                  str_2 = (xmlChar *)0x0;
                  xmlSchemaHashKeySequence
                            (pxStack_18,&str_2,(xmlSchemaPSVIIDCKeyPtr *)ntItem->node,(int)ckey);
                  value = (xmlChar *)xmlHashLookup(*(xmlHashTablePtr *)&idc->nbFields,str_2);
                  if (str_2 != (xmlChar *)0x0) {
                    (*xmlFree)(str_2);
                    str_2 = (xmlChar *)0x0;
                  }
                }
                for (; value != (xmlChar *)0x0; value = *(xmlChar **)value) {
                  e = *(xmlIDCHashEntryPtr_conflict *)((long)_i_1->items[*(int *)(value + 8)] + 8);
                  for (ckey._4_4_ = 0; ckey._4_4_ < (int)ckey; ckey._4_4_ = ckey._4_4_ + 1) {
                    bkey = (xmlSchemaPSVIIDCKeyPtr)(&ntItem->node->_private)[ckey._4_4_];
                    bkeySeq = (xmlSchemaPSVIIDCKeyPtr *)(&e->next)[ckey._4_4_];
                    key._4_4_ = xmlSchemaAreValuesEqual
                                          (bkey->val,
                                           *(xmlSchemaValPtr *)&((xmlIDCHashEntryPtr)bkeySeq)->index
                                          );
                    if (key._4_4_ == -1) {
                      return -1;
                    }
                    if (key._4_4_ == 0) break;
                  }
                  if (key._4_4_ == 1) break;
                }
                pxVar3 = pxStack_18;
                item_00 = targets;
                if (value == (xmlChar *)0x0) goto LAB_002391c9;
                strB = (xmlChar *)0x0;
                value_1 = (xmlChar *)0x0;
                pxVar8 = xmlSchemaFormatIDCKeySequence
                                   (pxStack_18,&strB,(xmlSchemaPSVIIDCKeyPtr *)ntItem->node,
                                    (int)ckey);
                pxVar5 = xmlSchemaGetIDCDesignation(&value_1,(xmlSchemaIDCPtr_conflict)targets);
                xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pxVar3,XML_SCHEMAV_CVC_IDC,
                                   (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)item_00,
                                   "Duplicate key-sequence %s in %s",pxVar8,pxVar5);
                if (strB != (xmlChar *)0x0) {
                  (*xmlFree)(strB);
                  strB = (xmlChar *)0x0;
                }
                if (value_1 != (xmlChar *)0x0) {
                  (*xmlFree)(value_1);
                  value_1 = (xmlChar *)0x0;
                }
              }
            }
            if ((ntItem != (xmlSchemaPSVIIDCNodePtr)0x0) && (ntItem->node != (xmlNodePtr)0x0)) {
              (*xmlFree)(ntItem->node);
              ntItem->node = (xmlNodePtr)0x0;
            }
          }
LAB_002395c0:
          nextsto->nbHistory = nextsto->nbHistory + -1;
        }
LAB_002395cd:
        if ((nextsto->nbHistory == 0) && (nextsto->depth == sto._4_4_)) {
          if (pxStack_18->xpathStates != nextsto) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)pxStack_18,"xmlSchemaXPathProcessHistory",
                       "The state object to be removed is not the first in the list");
          }
          _matchDepth = nextsto->next;
          pxStack_18->xpathStates = nextsto->next;
          nextsto->next = pxStack_18->xpathStatePool;
          pxStack_18->xpathStatePool = nextsto;
          nextsto = _matchDepth;
        }
        else {
          nextsto = nextsto->next;
        }
      }
      else {
        nextsto = nextsto->next;
      }
    }
  }
  return 0;
}

Assistant:

static int
xmlSchemaXPathProcessHistory(xmlSchemaValidCtxtPtr vctxt,
			     int depth)
{
    xmlSchemaIDCStateObjPtr sto, nextsto;
    int res, matchDepth;
    xmlSchemaPSVIIDCKeyPtr key = NULL;
    xmlSchemaTypePtr type = vctxt->inode->typeDef, simpleType = NULL;

    if (vctxt->xpathStates == NULL)
	return (0);
    sto = vctxt->xpathStates;

#ifdef DEBUG_IDC
    {
	xmlChar *str = NULL;
	xmlGenericError(xmlGenericErrorContext,
	    "IDC: BACK on %s, depth %d\n",
	    xmlSchemaFormatQName(&str, vctxt->inode->nsName,
		vctxt->inode->localName), vctxt->depth);
	FREE_AND_NULL(str)
    }
#endif
    /*
    * Evaluate the state objects.
    */
    while (sto != NULL) {
	res = xmlStreamPop((xmlStreamCtxtPtr) sto->xpathCtxt);
	if (res == -1) {
	    VERROR_INT("xmlSchemaXPathProcessHistory",
		"calling xmlStreamPop()");
	    return (-1);
	}
#ifdef DEBUG_IDC
	xmlGenericError(xmlGenericErrorContext, "IDC:   stream pop '%s'\n",
	    sto->sel->xpath);
#endif
	if (sto->nbHistory == 0)
	    goto deregister_check;

	matchDepth = sto->history[sto->nbHistory -1];

	/*
	* Only matches at the current depth are of interest.
	*/
	if (matchDepth != depth) {
	    sto = sto->next;
	    continue;
	}
	if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_FIELD) {
	    /*
	    * NOTE: According to
	    *   http://www.w3.org/Bugs/Public/show_bug.cgi?id=2198
	    *   ... the simple-content of complex types is also allowed.
	    */

	    if (WXS_IS_COMPLEX(type)) {
		if (WXS_HAS_SIMPLE_CONTENT(type)) {
		    /*
		    * Sanity check for complex types with simple content.
		    */
		    simpleType = type->contentTypeDef;
		    if (simpleType == NULL) {
			VERROR_INT("xmlSchemaXPathProcessHistory",
			    "field resolves to a CT with simple content "
			    "but the CT is missing the ST definition");
			return (-1);
		    }
		} else
		    simpleType = NULL;
	    } else
		simpleType = type;
	    if (simpleType == NULL) {
		xmlChar *str = NULL;

		/*
		* Not qualified if the field resolves to a node of non
		* simple type.
		*/
		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_IDC, NULL,
		    WXS_BASIC_CAST sto->matcher->aidc->def,
		    "The XPath '%s' of a field of %s does evaluate to a node of "
		    "non-simple type",
		    sto->sel->xpath,
		    xmlSchemaGetIDCDesignation(&str, sto->matcher->aidc->def));
		FREE_AND_NULL(str);
		sto->nbHistory--;
		goto deregister_check;
	    }

	    if ((key == NULL) && (vctxt->inode->val == NULL)) {
		/*
		* Failed to provide the normalized value; maybe
		* the value was invalid.
		*/
		VERROR(XML_SCHEMAV_CVC_IDC,
		    WXS_BASIC_CAST sto->matcher->aidc->def,
		    "Warning: No precomputed value available, the value "
		    "was either invalid or something strange happened");
		sto->nbHistory--;
		goto deregister_check;
	    } else {
		xmlSchemaIDCMatcherPtr matcher = sto->matcher;
		xmlSchemaPSVIIDCKeyPtr *keySeq;
		int pos, idx;

		/*
		* The key will be anchored on the matcher's list of
		* key-sequences. The position in this list is determined
		* by the target node's depth relative to the matcher's
		* depth of creation (i.e. the depth of the scope element).
		*
		* Element        Depth    Pos   List-entries
		* <scope>          0              NULL
		*   <bar>          1              NULL
		*     <target/>    2       2      target
		*   <bar>
                * </scope>
		*
		* The size of the list is only dependent on the depth of
		* the tree.
		* An entry will be NULLed in selector_leave, i.e. when
		* we hit the target's
		*/
		pos = sto->depth - matcher->depth;
		idx = sto->sel->index;

		/*
		* Create/grow the array of key-sequences.
		*/
		if (matcher->keySeqs == NULL) {
		    if (pos > 9)
			matcher->sizeKeySeqs = pos * 2;
		    else
			matcher->sizeKeySeqs = 10;
		    matcher->keySeqs = (xmlSchemaPSVIIDCKeyPtr **)
			xmlMalloc(matcher->sizeKeySeqs *
			sizeof(xmlSchemaPSVIIDCKeyPtr *));
		    if (matcher->keySeqs == NULL) {
			xmlSchemaVErrMemory(NULL,
			    "allocating an array of key-sequences",
			    NULL);
			return(-1);
		    }
		    memset(matcher->keySeqs, 0,
			matcher->sizeKeySeqs *
			sizeof(xmlSchemaPSVIIDCKeyPtr *));
		} else if (pos >= matcher->sizeKeySeqs) {
		    int i = matcher->sizeKeySeqs;

		    matcher->sizeKeySeqs *= 2;
		    matcher->keySeqs = (xmlSchemaPSVIIDCKeyPtr **)
			xmlRealloc(matcher->keySeqs,
			matcher->sizeKeySeqs *
			sizeof(xmlSchemaPSVIIDCKeyPtr *));
		    if (matcher->keySeqs == NULL) {
			xmlSchemaVErrMemory(NULL,
			    "reallocating an array of key-sequences",
			    NULL);
			return (-1);
		    }
		    /*
		    * The array needs to be NULLed.
		    * TODO: Use memset?
		    */
		    for (; i < matcher->sizeKeySeqs; i++)
			matcher->keySeqs[i] = NULL;
		}

		/*
		* Get/create the key-sequence.
		*/
		keySeq = matcher->keySeqs[pos];
		if (keySeq == NULL) {
		    goto create_sequence;
		} else if (keySeq[idx] != NULL) {
		    xmlChar *str = NULL;
		    /*
		    * cvc-identity-constraint:
		    * 3 For each node in the `target node set` all
		    * of the {fields}, with that node as the context
		    * node, evaluate to either an empty node-set or
		    * a node-set with exactly one member, which must
		    * have a simple type.
		    *
		    * The key was already set; report an error.
		    */
		    xmlSchemaCustomErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_IDC, NULL,
			WXS_BASIC_CAST matcher->aidc->def,
			"The XPath '%s' of a field of %s evaluates to a "
			"node-set with more than one member",
			sto->sel->xpath,
			xmlSchemaGetIDCDesignation(&str, matcher->aidc->def));
		    FREE_AND_NULL(str);
		    sto->nbHistory--;
		    goto deregister_check;
		} else
		    goto create_key;

create_sequence:
		/*
		* Create a key-sequence.
		*/
		keySeq = (xmlSchemaPSVIIDCKeyPtr *) xmlMalloc(
		    matcher->aidc->def->nbFields *
		    sizeof(xmlSchemaPSVIIDCKeyPtr));
		if (keySeq == NULL) {
		    xmlSchemaVErrMemory(NULL,
			"allocating an IDC key-sequence", NULL);
		    return(-1);
		}
		memset(keySeq, 0, matcher->aidc->def->nbFields *
		    sizeof(xmlSchemaPSVIIDCKeyPtr));
		matcher->keySeqs[pos] = keySeq;
create_key:
		/*
		* Create a key once per node only.
		*/
		if (key == NULL) {
		    key = (xmlSchemaPSVIIDCKeyPtr) xmlMalloc(
			sizeof(xmlSchemaPSVIIDCKey));
		    if (key == NULL) {
			xmlSchemaVErrMemory(NULL,
			    "allocating a IDC key", NULL);
			xmlFree(keySeq);
			matcher->keySeqs[pos] = NULL;
			return(-1);
		    }
		    /*
		    * Consume the compiled value.
		    */
		    key->type = simpleType;
		    key->val = vctxt->inode->val;
		    vctxt->inode->val = NULL;
		    /*
		    * Store the key in a global list.
		    */
		    if (xmlSchemaIDCStoreKey(vctxt, key) == -1) {
			xmlSchemaIDCFreeKey(key);
			return (-1);
		    }
		}
		keySeq[idx] = key;
	    }
	} else if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_SELECTOR) {

	    xmlSchemaPSVIIDCKeyPtr **keySeq = NULL;
	    /* xmlSchemaPSVIIDCBindingPtr bind; */
	    xmlSchemaPSVIIDCNodePtr ntItem;
	    xmlSchemaIDCMatcherPtr matcher;
	    xmlSchemaIDCPtr idc;
	    xmlSchemaItemListPtr targets;
	    int pos, i, j, nbKeys;
	    /*
	    * Here we have the following scenario:
	    * An IDC 'selector' state object resolved to a target node,
	    * during the time this target node was in the
	    * ancestor-or-self axis, the 'field' state object(s) looked
	    * out for matching nodes to create a key-sequence for this
	    * target node. Now we are back to this target node and need
	    * to put the key-sequence, together with the target node
	    * itself, into the node-table of the corresponding IDC
	    * binding.
	    */
	    matcher = sto->matcher;
	    idc = matcher->aidc->def;
	    nbKeys = idc->nbFields;
	    pos = depth - matcher->depth;
	    /*
	    * Check if the matcher has any key-sequences at all, plus
	    * if it has a key-sequence for the current target node.
	    */
	    if ((matcher->keySeqs == NULL) ||
		(matcher->sizeKeySeqs <= pos)) {
		if (idc->type == XML_SCHEMA_TYPE_IDC_KEY)
		    goto selector_key_error;
		else
		    goto selector_leave;
	    }

	    keySeq = &(matcher->keySeqs[pos]);
	    if (*keySeq == NULL) {
		if (idc->type == XML_SCHEMA_TYPE_IDC_KEY)
		    goto selector_key_error;
		else
		    goto selector_leave;
	    }

	    for (i = 0; i < nbKeys; i++) {
		if ((*keySeq)[i] == NULL) {
		    /*
		    * Not qualified, if not all fields did resolve.
		    */
		    if (idc->type == XML_SCHEMA_TYPE_IDC_KEY) {
			/*
			* All fields of a "key" IDC must resolve.
			*/
			goto selector_key_error;
		    }
		    goto selector_leave;
		}
	    }
	    /*
	    * All fields did resolve.
	    */

	    /*
	    * 4.1 If the {identity-constraint category} is unique(/key),
	    * then no two members of the `qualified node set` have
	    * `key-sequences` whose members are pairwise equal, as
	    * defined by Equal in [XML Schemas: Datatypes].
	    *
	    * Get the IDC binding from the matcher and check for
	    * duplicate key-sequences.
	    */
#if 0
	    bind = xmlSchemaIDCAcquireBinding(vctxt, matcher);
#endif
	    targets = xmlSchemaIDCAcquireTargetList(vctxt, matcher);
	    if ((idc->type != XML_SCHEMA_TYPE_IDC_KEYREF) &&
		(targets->nbItems != 0)) {
		xmlSchemaPSVIIDCKeyPtr ckey, bkey, *bkeySeq;
		xmlIDCHashEntryPtr e;

		res = 0;

		if (!matcher->htab)
		    e = NULL;
		else {
		    xmlChar *value = NULL;
		    xmlSchemaHashKeySequence(vctxt, &value, *keySeq, nbKeys);
		    e = xmlHashLookup(matcher->htab, value);
		    FREE_AND_NULL(value);
		}

		/*
		* Compare the key-sequences, key by key.
		*/
		for (;e; e = e->next) {
		    bkeySeq =
			((xmlSchemaPSVIIDCNodePtr) targets->items[e->index])->keys;
		    for (j = 0; j < nbKeys; j++) {
			ckey = (*keySeq)[j];
			bkey = bkeySeq[j];
			res = xmlSchemaAreValuesEqual(ckey->val, bkey->val);
			if (res == -1) {
			    return (-1);
			} else if (res == 0) {
			    /*
			    * One of the keys differs, so the key-sequence
			    * won't be equal; get out.
			    */
			    break;
			}
		    }
		    if (res == 1) {
			/*
			* Duplicate key-sequence found.
			*/
			break;
		    }
		}
		if (e) {
		    xmlChar *str = NULL, *strB = NULL;
		    /*
		    * TODO: Try to report the key-sequence.
		    */
		    xmlSchemaCustomErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_IDC, NULL,
			WXS_BASIC_CAST idc,
			"Duplicate key-sequence %s in %s",
			xmlSchemaFormatIDCKeySequence(vctxt, &str,
			    (*keySeq), nbKeys),
			xmlSchemaGetIDCDesignation(&strB, idc));
		    FREE_AND_NULL(str);
		    FREE_AND_NULL(strB);
		    goto selector_leave;
		}
	    }
	    /*
	    * Add a node-table item to the IDC binding.
	    */
	    ntItem = (xmlSchemaPSVIIDCNodePtr) xmlMalloc(
		sizeof(xmlSchemaPSVIIDCNode));
	    if (ntItem == NULL) {
		xmlSchemaVErrMemory(NULL,
		    "allocating an IDC node-table item", NULL);
		xmlFree(*keySeq);
		*keySeq = NULL;
		return(-1);
	    }
	    memset(ntItem, 0, sizeof(xmlSchemaPSVIIDCNode));

	    /*
	    * Store the node-table item in a global list.
	    */
	    if (idc->type != XML_SCHEMA_TYPE_IDC_KEYREF) {
		if (xmlSchemaIDCStoreNodeTableItem(vctxt, ntItem) == -1) {
		    xmlFree(ntItem);
		    xmlFree(*keySeq);
		    *keySeq = NULL;
		    return (-1);
		}
		ntItem->nodeQNameID = -1;
	    } else {
		/*
		* Save a cached QName for this node on the IDC node, to be
		* able to report it, even if the node is not saved.
		*/
		ntItem->nodeQNameID = xmlSchemaVAddNodeQName(vctxt,
		    vctxt->inode->localName, vctxt->inode->nsName);
		if (ntItem->nodeQNameID == -1) {
		    xmlFree(ntItem);
		    xmlFree(*keySeq);
		    *keySeq = NULL;
		    return (-1);
		}
	    }
	    /*
	    * Init the node-table item: Save the node, position and
	    * consume the key-sequence.
	    */
	    ntItem->node = vctxt->node;
	    ntItem->nodeLine = vctxt->inode->nodeLine;
	    ntItem->keys = *keySeq;
	    *keySeq = NULL;
#if 0
	    if (xmlSchemaIDCAppendNodeTableItem(bind, ntItem) == -1)
#endif
	    if (xmlSchemaItemListAdd(targets, ntItem) == -1) {
		if (idc->type == XML_SCHEMA_TYPE_IDC_KEYREF) {
		    /*
		    * Free the item, since keyref items won't be
		    * put on a global list.
		    */
		    xmlFree(ntItem->keys);
		    xmlFree(ntItem);
		}
		return (-1);
	    }
	    if (idc->type != XML_SCHEMA_TYPE_IDC_KEYREF) {
		xmlChar *value = NULL;
		xmlIDCHashEntryPtr r, e;
		if (!matcher->htab)
		  matcher->htab = xmlHashCreate(4);
		xmlSchemaHashKeySequence(vctxt, &value, ntItem->keys, nbKeys);
		e = xmlMalloc(sizeof *e);
		e->index = targets->nbItems - 1;
		r = xmlHashLookup(matcher->htab, value);
		if (r) {
		    e->next = r->next;
		    r->next = e;
		} else {
		    e->next = NULL;
		    xmlHashAddEntry(matcher->htab, value, e);
		}
		FREE_AND_NULL(value);
	    }

	    goto selector_leave;
selector_key_error:
	    {
		xmlChar *str = NULL;
		/*
		* 4.2.1 (KEY) The `target node set` and the
		* `qualified node set` are equal, that is, every
		* member of the `target node set` is also a member
		* of the `qualified node set` and vice versa.
		*/
		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_IDC, NULL,
		    WXS_BASIC_CAST idc,
		    "Not all fields of %s evaluate to a node",
		    xmlSchemaGetIDCDesignation(&str, idc), NULL);
		FREE_AND_NULL(str);
	    }
selector_leave:
	    /*
	    * Free the key-sequence if not added to the IDC table.
	    */
	    if ((keySeq != NULL) && (*keySeq != NULL)) {
		xmlFree(*keySeq);
		*keySeq = NULL;
	    }
	} /* if selector */

	sto->nbHistory--;

deregister_check:
	/*
	* Deregister state objects if they reach the depth of creation.
	*/
	if ((sto->nbHistory == 0) && (sto->depth == depth)) {
#ifdef DEBUG_IDC
	    xmlGenericError(xmlGenericErrorContext, "IDC:   STO pop '%s'\n",
		sto->sel->xpath);
#endif
	    if (vctxt->xpathStates != sto) {
		VERROR_INT("xmlSchemaXPathProcessHistory",
		    "The state object to be removed is not the first "
		    "in the list");
	    }
	    nextsto = sto->next;
	    /*
	    * Unlink from the list of active XPath state objects.
	    */
	    vctxt->xpathStates = sto->next;
	    sto->next = vctxt->xpathStatePool;
	    /*
	    * Link it to the pool of reusable state objects.
	    */
	    vctxt->xpathStatePool = sto;
	    sto = nextsto;
	} else
	    sto = sto->next;
    } /* while (sto != NULL) */
    return (0);
}